

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3auxBestIndexMethod(sqlite3_vtab *pVTab,sqlite3_index_info *pInfo)

{
  uchar uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  uchar *puVar9;
  ulong uVar10;
  double dVar11;
  
  if (((pInfo->nOrderBy == 1) && (pInfo->aOrderBy->iColumn == 0)) && (pInfo->aOrderBy->desc == '\0')
     ) {
    pInfo->orderByConsumed = 1;
  }
  if ((long)pInfo->nConstraint < 1) {
    pInfo->idxNum = 0;
    pInfo->estimatedCost = 20000.0;
  }
  else {
    puVar9 = &pInfo->aConstraint->usable;
    uVar5 = 0xffffffff;
    uVar10 = 0;
    uVar2 = 0xffffffff;
    uVar3 = 0xffffffff;
    uVar8 = 0xffffffff;
    do {
      if (*puVar9 != '\0') {
        uVar1 = puVar9[-1];
        if (((sqlite3_index_constraint *)(puVar9 + -5))->iColumn == 0) {
          if (uVar1 == '\x02') {
            uVar5 = uVar10 & 0xffffffff;
          }
          if ((uVar1 - 8 & 0xf7) == 0) {
            uVar3 = uVar10 & 0xffffffff;
          }
          if (uVar1 == '\x04') {
            uVar8 = uVar10 & 0xffffffff;
          }
          if (uVar1 == ' ') {
            uVar8 = uVar10 & 0xffffffff;
          }
        }
        uVar6 = uVar10 & 0xffffffff;
        if (uVar1 != '\x02') {
          uVar6 = uVar2;
        }
        if (((sqlite3_index_constraint *)(puVar9 + -5))->iColumn == 4) {
          uVar2 = uVar6;
        }
      }
      uVar10 = uVar10 + 1;
      puVar9 = puVar9 + 0xc;
    } while ((long)pInfo->nConstraint != uVar10);
    if ((int)uVar5 < 0) {
      pInfo->idxNum = 0;
      pInfo->estimatedCost = 20000.0;
      if ((int)uVar8 < 0) {
        iVar4 = 1;
        iVar7 = 4;
        dVar11 = 20000.0;
      }
      else {
        pInfo->idxNum = 2;
        pInfo->aConstraintUsage[uVar8].argvIndex = 1;
        pInfo->estimatedCost = 10000.0;
        iVar4 = 2;
        iVar7 = 6;
        dVar11 = 10000.0;
      }
      if (-1 < (int)uVar3) {
        pInfo->idxNum = iVar7;
        pInfo->aConstraintUsage[uVar3].argvIndex = iVar4;
        iVar4 = iVar4 + 1;
        dVar11 = dVar11 * 0.5;
        pInfo->estimatedCost = dVar11;
      }
    }
    else {
      pInfo->idxNum = 1;
      pInfo->aConstraintUsage[uVar5].argvIndex = 1;
      pInfo->estimatedCost = 5.0;
      iVar4 = 2;
      dVar11 = 5.0;
    }
    if (-1 < (int)uVar2) {
      pInfo->aConstraintUsage[uVar2].argvIndex = iVar4;
      pInfo->estimatedCost = dVar11 + -1.0;
    }
  }
  return 0;
}

Assistant:

static int fts3auxBestIndexMethod(
  sqlite3_vtab *pVTab, 
  sqlite3_index_info *pInfo
){
  int i;
  int iEq = -1;
  int iGe = -1;
  int iLe = -1;
  int iLangid = -1;
  int iNext = 1;                  /* Next free argvIndex value */

  UNUSED_PARAMETER(pVTab);

  /* This vtab delivers always results in "ORDER BY term ASC" order. */
  if( pInfo->nOrderBy==1 
   && pInfo->aOrderBy[0].iColumn==0 
   && pInfo->aOrderBy[0].desc==0
  ){
    pInfo->orderByConsumed = 1;
  }

  /* Search for equality and range constraints on the "term" column. 
  ** And equality constraints on the hidden "languageid" column. */
  for(i=0; i<pInfo->nConstraint; i++){
    if( pInfo->aConstraint[i].usable ){
      int op = pInfo->aConstraint[i].op;
      int iCol = pInfo->aConstraint[i].iColumn;

      if( iCol==0 ){
        if( op==SQLITE_INDEX_CONSTRAINT_EQ ) iEq = i;
        if( op==SQLITE_INDEX_CONSTRAINT_LT ) iLe = i;
        if( op==SQLITE_INDEX_CONSTRAINT_LE ) iLe = i;
        if( op==SQLITE_INDEX_CONSTRAINT_GT ) iGe = i;
        if( op==SQLITE_INDEX_CONSTRAINT_GE ) iGe = i;
      }
      if( iCol==4 ){
        if( op==SQLITE_INDEX_CONSTRAINT_EQ ) iLangid = i;
      }
    }
  }

  if( iEq>=0 ){
    pInfo->idxNum = FTS4AUX_EQ_CONSTRAINT;
    pInfo->aConstraintUsage[iEq].argvIndex = iNext++;
    pInfo->estimatedCost = 5;
  }else{
    pInfo->idxNum = 0;
    pInfo->estimatedCost = 20000;
    if( iGe>=0 ){
      pInfo->idxNum += FTS4AUX_GE_CONSTRAINT;
      pInfo->aConstraintUsage[iGe].argvIndex = iNext++;
      pInfo->estimatedCost /= 2;
    }
    if( iLe>=0 ){
      pInfo->idxNum += FTS4AUX_LE_CONSTRAINT;
      pInfo->aConstraintUsage[iLe].argvIndex = iNext++;
      pInfo->estimatedCost /= 2;
    }
  }
  if( iLangid>=0 ){
    pInfo->aConstraintUsage[iLangid].argvIndex = iNext++;
    pInfo->estimatedCost--;
  }

  return SQLITE_OK;
}